

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O0

QImage * blendedImage(QImage *start,QImage *end,float alpha)

{
  QRgb rgb;
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Format FVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  QRgb QVar14;
  ulong uVar15;
  long lVar16;
  QImage *in_RDI;
  long in_FS_OFFSET;
  quint32 fp;
  quint32 bp;
  int sx;
  quint32 *front;
  quint32 *back;
  quint32 *mixed;
  int sy;
  uchar *front_data;
  uchar *back_data;
  uchar *mixed_data;
  qsizetype bpl;
  int sh;
  int sw;
  int ia;
  int a;
  QImage *blended;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int local_94;
  int local_74;
  long local_70;
  long local_68;
  long local_60;
  QImage local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar15 = QImage::isNull();
  if (((uVar15 & 1) == 0) && (uVar15 = QImage::isNull(), (uVar15 & 1) == 0)) {
    *(undefined1 **)(in_RDI + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)(in_RDI + 8) = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage(in_RDI);
    iVar2 = qRound(0.0);
    iVar3 = 0x100 - iVar2;
    iVar4 = QImage::width();
    iVar5 = QImage::height();
    lVar16 = QImage::bytesPerLine();
    iVar6 = QImage::depth();
    if (iVar6 == 0x20) {
      FVar7 = QImage::format();
      QImage::QImage(local_20,iVar4,iVar5,FVar7);
      QImage::operator=((QImage *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                        (QImage *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      QImage::~QImage(local_20);
      dVar1 = (double)QImage::devicePixelRatio();
      QImage::setDevicePixelRatio(dVar1);
      local_60 = QImage::bits();
      local_68 = QImage::bits();
      local_70 = QImage::bits();
      for (local_74 = 0; local_74 < iVar5; local_74 = local_74 + 1) {
        for (local_94 = 0; local_94 < iVar4; local_94 = local_94 + 1) {
          QVar14 = *(QRgb *)(local_68 + (long)local_94 * 4);
          rgb = *(QRgb *)(local_70 + (long)local_94 * 4);
          iVar6 = qRed(QVar14);
          iVar8 = qRed(rgb);
          iVar6 = iVar6 * iVar3 + iVar8 * iVar2 >> 8;
          iVar8 = qGreen(QVar14);
          iVar8 = iVar8 * iVar3;
          iVar9 = qGreen(rgb);
          iVar10 = qBlue(QVar14);
          iVar10 = iVar10 * iVar3;
          iVar11 = qBlue(rgb);
          iVar12 = qAlpha(QVar14);
          iVar12 = iVar12 * iVar3;
          iVar13 = qAlpha(rgb);
          QVar14 = qRgba(iVar6,iVar8 + iVar9 * iVar2 >> 8,iVar10 + iVar11 * iVar2 >> 8,
                         iVar12 + iVar13 * iVar2 >> 8);
          *(QRgb *)(local_60 + (long)local_94 * 4) = QVar14;
        }
        local_60 = lVar16 + local_60;
        local_68 = lVar16 + local_68;
        local_70 = lVar16 + local_70;
      }
    }
  }
  else {
    QImage::QImage(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QImage blendedImage(const QImage &start, const QImage &end, float alpha)
{
    if (start.isNull() || end.isNull())
        return QImage();

    QImage blended;
    const int a = qRound(alpha*256);
    const int ia = 256 - a;
    const int sw = start.width();
    const int sh = start.height();
    const qsizetype bpl = start.bytesPerLine();
    switch (start.depth()) {
    case 32:
        {
            blended = QImage(sw, sh, start.format());
            blended.setDevicePixelRatio(start.devicePixelRatio());
            uchar *mixed_data = blended.bits();
            const uchar *back_data = start.bits();
            const uchar *front_data = end.bits();
            for (int sy = 0; sy < sh; sy++) {
                quint32* mixed = (quint32*)mixed_data;
                const quint32* back = (const quint32*)back_data;
                const quint32* front = (const quint32*)front_data;
                for (int sx = 0; sx < sw; sx++) {
                    quint32 bp = back[sx];
                    quint32 fp = front[sx];
                    mixed[sx] =  qRgba ((qRed(bp)*ia + qRed(fp)*a)>>8,
                                        (qGreen(bp)*ia + qGreen(fp)*a)>>8,
                                        (qBlue(bp)*ia + qBlue(fp)*a)>>8,
                                        (qAlpha(bp)*ia + qAlpha(fp)*a)>>8);
                }
                mixed_data += bpl;
                back_data += bpl;
                front_data += bpl;
            }
        }
        break;
    default:
        break;
    }
    return blended;
}